

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams_from_file.hpp
# Opt level: O2

void __thiscall
iutest::detail::iuCsvFileParamsGenerator<float>::AppendParams
          (iuCsvFileParamsGenerator<float> *this,params_t *params,string *data)

{
  bool bVar1;
  float param;
  value_type_conflict2 local_14;
  
  bVar1 = StringIsBlank(data);
  if (!bVar1) {
    std::__cxx11::stof(data,(size_t *)0x0);
    std::vector<float,_std::allocator<float>_>::push_back(params,&local_14);
  }
  return;
}

Assistant:

void AppendParams(params_t& params, const ::std::string& data)
    {
        if( StringIsBlank(data) )
        {
            return;
        }
        T param;
        if( !StringToValue(data, param) )
        {
            return;
        }
        params.push_back(param);
    }